

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O1

bool __thiscall
Diligent::Serializer<(Diligent::SerializerMode)1>::Copy<Diligent::ImmutableSamplerAttribsVk_const>
          (Serializer<(Diligent::SerializerMode)1> *this,ImmutableSamplerAttribsVk *pData,
          size_t Size)

{
  TPointer puVar1;
  TPointer puVar2;
  char (*in_R8) [7];
  string msg;
  size_t local_40;
  string local_38;
  
  puVar2 = this->m_End;
  puVar1 = this->m_Ptr + Size;
  local_40 = Size;
  if (puVar2 < puVar1) {
    FormatString<char[27],unsigned_long,char[7]>
              (&local_38,(Diligent *)"Note enough data to write ",(char (*) [27])&local_40,
               (unsigned_long *)0x76928e,in_R8);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"Copy",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x154);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    memcpy(this->m_Ptr,pData,Size);
    this->m_Ptr = this->m_Ptr + local_40;
  }
  return puVar1 <= puVar2;
}

Assistant:

bool Serializer<SerializerMode::Write>::Copy(T* pData, size_t Size)
{
    static_assert(IsAlignedBaseClass<T>::Value, "There is unused space at the end of the structure that may be filled with garbage. Use padding to zero-initialize this space and avoid nasty issues.");
    CHECK_REMAINING_SIZE(Size, "Note enough data to write ", Size, " bytes");
    std::memcpy(m_Ptr, pData, Size);
    m_Ptr += Size;
    return true;
}